

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

iterator __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::operator()
          (arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
           *this,basic_string_view<char> value)

{
  format_specs *spec;
  format_error *this_00;
  ulong uVar1;
  ulong uVar2;
  str_writer<char> local_20;
  
  uVar2 = value.size_;
  local_20.s = value.data_;
  spec = this->specs_;
  if ((spec->type_ != '\0') && (spec->type_ != 's')) {
    this_00 = (format_error *)__cxa_allocate_exception(0x10);
    format_error::format_error(this_00,"invalid type specifier");
    __cxa_throw(this_00,&format_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar1 = (ulong)spec->precision_;
  local_20.size = uVar2;
  if (uVar1 < uVar2) {
    local_20.size = uVar1;
  }
  if ((long)uVar1 < 0) {
    local_20.size = uVar2;
  }
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
  write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::str_writer<char>>
            ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *)this
             ,local_20.size,&spec->super_align_spec,&local_20);
  return (iterator)(this->writer_).out_.container;
}

Assistant:

iterator operator()(basic_string_view<char_type> value) {
    internal::check_string_type_spec(specs_.type_, internal::error_handler());
    writer_.write_str(value, specs_);
    return out();
  }